

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry_const&>
          (QMovableArrayOps<QPixmapIconEngineEntry> *this,qsizetype i,QPixmapIconEngineEntry *args)

{
  QPixmapIconEngineEntry **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QPixmapIconEngineEntry *pQVar4;
  QPixmapIconEngineEntry *pQVar5;
  Data *pDVar6;
  Mode MVar7;
  State SVar8;
  QExplicitlySharedDataPointer<QPlatformPixmap> QVar9;
  QArrayData *pQVar10;
  char16_t *pcVar11;
  undefined1 *puVar12;
  QPixmapIconEngineEntry *__dest;
  long in_FS_OFFSET;
  bool bVar13;
  QPixmapIconEngineEntry tmp;
  Inserter local_a0;
  undefined1 local_78 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QSize local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
           super_QArrayDataPointer<QPixmapIconEngineEntry>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00274d75:
    local_48 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)local_78,&args->pixmap);
    pQStack_60 = &((args->fileName).d.d)->super_QArrayData;
    local_58 = (args->fileName).d.ptr;
    puStack_50 = (undefined1 *)(args->fileName).d.size;
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (((Data *)pQStack_60)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)pQStack_60)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_48 = args->size;
    puStack_40._0_4_ = args->mode;
    puStack_40._4_4_ = args->state;
    bVar13 = (this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
             super_QArrayDataPointer<QPixmapIconEngineEntry>.size != 0;
    QArrayDataPointer<QPixmapIconEngineEntry>::detachAndGrow
              ((QArrayDataPointer<QPixmapIconEngineEntry> *)this,(uint)(i == 0 && bVar13),1,
               (QPixmapIconEngineEntry **)0x0,(QArrayDataPointer<QPixmapIconEngineEntry> *)0x0);
    if (i == 0 && bVar13) {
      pQVar4 = (this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
               super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr;
      QPaintDevice::QPaintDevice((QPaintDevice *)(pQVar4 + -1));
      puVar12 = puStack_50;
      pcVar11 = local_58;
      pQVar10 = pQStack_60;
      QVar9.d.ptr = local_68.d.ptr;
      pQVar4[-1].pixmap.super_QPaintDevice._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_007d25a8
      ;
      local_68.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
      pQVar4[-1].pixmap.data.d.ptr = (QPlatformPixmap *)QVar9.d.ptr;
      pQStack_60 = (QArrayData *)0x0;
      pQVar4[-1].fileName.d.d = (Data *)pQVar10;
      local_58 = (char16_t *)0x0;
      pQVar4[-1].fileName.d.ptr = pcVar11;
      puStack_50 = (undefined1 *)0x0;
      pQVar4[-1].fileName.d.size = (qsizetype)puVar12;
      pQVar4[-1].size = local_48;
      *(undefined1 **)&pQVar4[-1].mode = puStack_40;
      ppQVar1 = &(this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
                 super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
                super_QArrayDataPointer<QPixmapIconEngineEntry>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
               super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr;
      pQVar4 = pQVar5 + i;
      pQVar5 = pQVar5 + i;
      __dest = pQVar5 + 1;
      local_a0.nInserts = 1;
      local_a0.bytes =
           ((this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
            super_QArrayDataPointer<QPixmapIconEngineEntry>.size - i) * 0x40;
      local_a0.data = (QArrayDataPointer<QPixmapIconEngineEntry> *)this;
      local_a0.displaceTo = __dest;
      memmove(__dest,pQVar4,local_a0.bytes);
      QPaintDevice::QPaintDevice((QPaintDevice *)pQVar4);
      puVar12 = puStack_50;
      pcVar11 = local_58;
      pQVar10 = pQStack_60;
      QVar9.d.ptr = local_68.d.ptr;
      (pQVar5->pixmap).super_QPaintDevice._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_007d25a8;
      local_68.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
      (pQVar5->pixmap).data.d.ptr = (QPlatformPixmap *)QVar9.d.ptr;
      pQStack_60 = (QArrayData *)0x0;
      (pQVar5->fileName).d.d = (Data *)pQVar10;
      local_58 = (char16_t *)0x0;
      (pQVar5->fileName).d.ptr = pcVar11;
      puStack_50 = (undefined1 *)0x0;
      (pQVar5->fileName).d.size = (qsizetype)puVar12;
      pQVar5->size = local_48;
      *(undefined1 **)&pQVar5->mode = puStack_40;
      local_a0.displaceFrom = __dest;
      Inserter::~Inserter(&local_a0);
    }
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_60,2,0x10);
      }
    }
    QPixmap::~QPixmap((QPixmap *)local_78);
  }
  else {
    if (((this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
         super_QArrayDataPointer<QPixmapIconEngineEntry>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
                 super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 6) +
       i)) {
      pQVar5 = pQVar4 + i;
      QPixmap::QPixmap(&pQVar5->pixmap,&args->pixmap);
      pDVar6 = (args->fileName).d.d;
      pQVar4[i].fileName.d.d = pDVar6;
      pQVar4[i].fileName.d.ptr = (args->fileName).d.ptr;
      pQVar4[i].fileName.d.size = (args->fileName).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      MVar7 = args->mode;
      SVar8 = args->state;
      *(QSize *)&(pQVar5->size).wd = args->size;
      pQVar5->mode = MVar7;
      pQVar5->state = SVar8;
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
                   super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr,
         (QPixmapIconEngineEntry *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar4))
      goto LAB_00274d75;
      QPixmap::QPixmap(&pQVar4[-1].pixmap,&args->pixmap);
      pDVar6 = (args->fileName).d.d;
      pQVar4[-1].fileName.d.d = pDVar6;
      pQVar4[-1].fileName.d.ptr = (args->fileName).d.ptr;
      pQVar4[-1].fileName.d.size = (args->fileName).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      MVar7 = args->mode;
      SVar8 = args->state;
      pQVar4[-1].size = args->size;
      pQVar4[-1].mode = MVar7;
      pQVar4[-1].state = SVar8;
      ppQVar1 = &(this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
                 super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
              super_QArrayDataPointer<QPixmapIconEngineEntry>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }